

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O2

shared_ptr<gui::ColorPickerStyle> __thiscall
gui::DefaultTheme::makeColorPickerStyle(DefaultTheme *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::ColorPickerStyle> sVar1;
  Vector2f local_18;
  
  std::make_shared<gui::ColorPickerStyle,gui::Gui_const&>((Gui *)this);
  ColorPickerStyle::setOutlineColor
            ((ColorPickerStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::White);
  ColorPickerStyle::setOutlineThickness((ColorPickerStyle *)(this->super_Theme)._vptr_Theme,-2.0);
  ColorPickerStyle::setDotRadius((ColorPickerStyle *)(this->super_Theme)._vptr_Theme,5.0);
  ColorPickerStyle::setBarWidth((ColorPickerStyle *)(this->super_Theme)._vptr_Theme,20.0);
  ColorPickerStyle::setBarSpacing((ColorPickerStyle *)(this->super_Theme)._vptr_Theme,5.0);
  local_18.x = 5.0;
  local_18.y = 5.0;
  ColorPickerStyle::setBoxSpacing((ColorPickerStyle *)(this->super_Theme)._vptr_Theme,&local_18);
  sVar1.super___shared_ptr<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::ColorPickerStyle>)
         sVar1.super___shared_ptr<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ColorPickerStyle> DefaultTheme::makeColorPickerStyle() const {
    auto style = std::make_shared<ColorPickerStyle>(gui_);
    style->setOutlineColor(sf::Color::White);
    style->setOutlineThickness(-2.0f);

    style->setDotRadius(5.0f);
    style->setBarWidth(20.0f);
    style->setBarSpacing(5.0f);
    style->setBoxSpacing({5.0f, 5.0f});

    return style;
}